

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<char>::emplaceRealloc<char_const&>
          (SmallVectorBase<char> *this,pointer pos,char *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator pcVar3;
  char *__result;
  char *pcVar4;
  EVP_PKEY_CTX *ctx;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  char *args_local;
  pointer pos_local;
  SmallVectorBase<char> *this_local;
  
  sVar1 = this->len;
  sVar2 = max_size(this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = calculateGrowth(this,this->len + 1);
  pcVar3 = begin(this);
  __result = (char *)slang::detail::allocArray(capacity,1);
  pcVar4 = __result + ((long)pos - (long)pcVar3);
  *pcVar4 = *args;
  pcVar3 = end(this);
  if (pos == pcVar3) {
    pcVar3 = begin(this);
    ctx = (EVP_PKEY_CTX *)end(this);
    std::uninitialized_move<char*,char*>(pcVar3,(char *)ctx,__result);
  }
  else {
    pcVar3 = begin(this);
    std::uninitialized_move<char*,char*>(pcVar3,pos,__result);
    ctx = (EVP_PKEY_CTX *)end(this);
    std::uninitialized_move<char*,char*>(pos,(char *)ctx,pcVar4 + 1);
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = __result;
  return pcVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}